

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3EvalNextRow(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  Fts3Expr *pFVar1;
  Fts3Expr *pFVar2;
  Fts3Table *pTab;
  sqlite3_int64 sVar3;
  u8 uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  char *__dest;
  ulong uVar8;
  Fts3Phrase *pFVar9;
  long extraout_RDX;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  char **ppcVar14;
  Fts3Expr *pFVar15;
  int iVar16;
  ulong uVar17;
  TokenDoclist *p;
  size_t __n;
  bool bVar18;
  u8 uVar19;
  u8 local_111;
  Fts3Phrase *local_110;
  u8 local_101;
  Fts3Expr *local_100;
  ulong local_f8;
  int *local_f0;
  int local_e8;
  int local_e4;
  char *local_e0;
  u8 *local_d8;
  long local_d0;
  char *pR;
  char *pL;
  TokenDoclist a [4];
  
  if (*pRc != 0) {
    return;
  }
  uVar19 = pCsr->bDesc;
  pExpr->bStart = '\x01';
  local_100 = pExpr;
  switch(pExpr->eType) {
  case 1:
  case 3:
    pFVar1 = pExpr->pLeft;
    pFVar2 = pExpr->pRight;
    if (pFVar1->bDeferred == '\0') {
      uVar4 = pFVar2->bDeferred;
      fts3EvalNextRow(pCsr,pFVar1,pRc);
      pFVar15 = pFVar2;
      if (uVar4 == '\0') {
        while (fts3EvalNextRow(pCsr,pFVar15,pRc), pFVar1->bEof == '\0') {
          uVar4 = pFVar2->bEof;
          if (uVar4 != '\0') {
            lVar10 = pFVar1->iDocid;
LAB_0016ff83:
            local_100->iDocid = lVar10;
            bVar18 = uVar4 != '\0';
            goto LAB_0016ff91;
          }
          lVar10 = pFVar1->iDocid;
          if (*pRc != 0) goto LAB_0016ff83;
          lVar13 = lVar10 - pFVar2->iDocid;
          lVar6 = -lVar13;
          if (uVar19 == '\0') {
            lVar6 = lVar13;
          }
          if (lVar6 == 0) goto LAB_0016ff83;
          pFVar15 = pFVar1;
          if (-1 < lVar6) {
            pFVar15 = pFVar2;
          }
        }
        local_100->iDocid = pFVar1->iDocid;
        bVar18 = true;
LAB_0016ff91:
        local_100->bEof = bVar18;
        if ((local_100->eType == 1) && (bVar18 != false)) {
          pFVar9 = pFVar2->pPhrase;
          if ((pFVar9 != (Fts3Phrase *)0x0) && ((pFVar9->doclist).aAll != (char *)0x0)) {
            while ((*pRc == 0 && (pFVar2->bEof == '\0'))) {
              memset((pFVar9->doclist).pList,0,(long)(pFVar9->doclist).nList);
              fts3EvalNextRow(pCsr,pFVar2,pRc);
            }
          }
          pFVar9 = pFVar1->pPhrase;
          if ((pFVar9 != (Fts3Phrase *)0x0) && ((pFVar9->doclist).aAll != (char *)0x0)) {
            while ((*pRc == 0 && (pFVar1->bEof == '\0'))) {
              memset((pFVar9->doclist).pList,0,(long)(pFVar9->doclist).nList);
              fts3EvalNextRow(pCsr,pFVar1,pRc);
            }
          }
        }
      }
      else {
        local_100->iDocid = pFVar1->iDocid;
        local_100->bEof = pFVar1->bEof;
      }
    }
    else {
      fts3EvalNextRow(pCsr,pFVar2,pRc);
      pExpr->iDocid = pFVar2->iDocid;
      pExpr->bEof = pFVar2->bEof;
    }
    break;
  case 2:
    pFVar1 = pExpr->pLeft;
    pFVar2 = pExpr->pRight;
    if (pFVar2->bStart == '\0') {
      fts3EvalNextRow(pCsr,pFVar2,pRc);
    }
    fts3EvalNextRow(pCsr,pFVar1,pRc);
    uVar4 = pFVar1->bEof;
    if (uVar4 == '\0') {
      while ((*pRc == 0 && (pFVar2->bEof == '\0'))) {
        lVar6 = pFVar1->iDocid - pFVar2->iDocid;
        lVar10 = -lVar6;
        if (uVar19 == '\0') {
          lVar10 = lVar6;
        }
        if (lVar10 < 1) break;
        fts3EvalNextRow(pCsr,pFVar2,pRc);
      }
      uVar4 = pFVar1->bEof;
    }
    pExpr->iDocid = pFVar1->iDocid;
    pExpr->bEof = uVar4;
    break;
  case 4:
    pFVar1 = pExpr->pLeft;
    pFVar2 = pExpr->pRight;
    uVar17 = -(ulong)(uVar19 != '\0') | 1;
    pFVar15 = pFVar1;
    if (pFVar2->bEof == '\0') {
      lVar10 = (pFVar1->iDocid - pFVar2->iDocid) * uVar17;
      if (((pFVar1->bEof != '\0') || (-1 < lVar10)) &&
         ((pFVar15 = pFVar2, pFVar1->bEof == '\0' && (lVar10 < 1)))) {
        fts3EvalNextRow(pCsr,pFVar1,pRc);
      }
    }
    fts3EvalNextRow(pCsr,pFVar15,pRc);
    if (pFVar1->bEof == '\0') {
      bVar18 = false;
    }
    else {
      bVar18 = pFVar2->bEof != '\0';
    }
    local_100->bEof = bVar18;
    if ((pFVar2->bEof == '\0') &&
       ((pFVar1->bEof != '\0' || (-1 < (long)((pFVar1->iDocid - pFVar2->iDocid) * uVar17))))) {
      local_100->iDocid = pFVar2->iDocid;
    }
    else {
      local_100->iDocid = pFVar1->iDocid;
    }
    break;
  default:
    pFVar9 = pExpr->pPhrase;
    local_f0 = pRc;
    fts3EvalInvalidatePoslist(pFVar9);
    local_d8 = &pExpr->bEof;
    pTab = (Fts3Table *)(pCsr->base).pVtab;
    local_110 = pFVar9;
    if (pFVar9->bIncr == 0) {
      if ((pCsr->bDesc == pTab->bDescIdx) || (iVar5 = (pFVar9->doclist).nAll, iVar5 == 0)) {
        fts3EvalDlPhraseNext(pTab,&pFVar9->doclist,local_d8);
      }
      else {
        sqlite3Fts3DoclistPrev
                  ((uint)pTab->bDescIdx,(pFVar9->doclist).aAll,iVar5,&(pFVar9->doclist).pNextDocid,
                   &(pFVar9->doclist).iDocid,&(pFVar9->doclist).nList,local_d8);
        (local_110->doclist).pList = (local_110->doclist).pNextDocid;
      }
      iVar5 = 0;
    }
    else {
      local_111 = '\0';
      if (pFVar9->nToken == 1) {
        iVar5 = sqlite3Fts3MsrIncrNext
                          (pTab,pFVar9->aToken[0].pSegcsr,&(pFVar9->doclist).iDocid,
                           &(pFVar9->doclist).pList,&(pFVar9->doclist).nList);
        uVar19 = (local_110->doclist).pList == (char *)0x0;
      }
      else {
        local_101 = pCsr->bDesc;
        a[3].pList = (char *)0x0;
        a[3].nList = 0;
        a[3]._28_4_ = 0;
        a[3].bIgnore = 0;
        a[3]._4_4_ = 0;
        a[3].iDocid = 0;
        a[2].pList = (char *)0x0;
        a[2].nList = 0;
        a[2]._28_4_ = 0;
        a[2].bIgnore = 0;
        a[2]._4_4_ = 0;
        a[2].iDocid = 0;
        a[1].pList = (char *)0x0;
        a[1].nList = 0;
        a[1]._28_4_ = 0;
        a[1].bIgnore = 0;
        a[1]._4_4_ = 0;
        a[1].iDocid = 0;
        a[0].pList = (char *)0x0;
        a[0].nList = 0;
        a[0]._28_4_ = 0;
        a[0].bIgnore = 0;
        a[0]._4_4_ = 0;
        a[0].iDocid = 0;
        uVar17 = -(ulong)(local_101 != '\0') | 1;
        iVar5 = 0;
        lVar10 = 0;
        while (p = a, (char)lVar10 == '\0') {
          lVar13 = 0;
          local_f8 = local_f8 & 0xffffffff00000000;
          lVar6 = 0;
          while (((iVar5 == 0 && (lVar13 < pFVar9->nToken)) && (local_111 == '\0'))) {
            iVar5 = incrPhraseTokenNext(pTab,pFVar9,(int)lVar13,p,&local_111);
            lVar10 = extraout_RDX;
            lVar7 = lVar6;
            if (p->bIgnore == 0) {
              lVar7 = p->iDocid;
              if ((int)local_f8 != 0) {
                lVar10 = -(lVar6 - lVar7);
                if (local_101 == '\0') {
                  lVar10 = lVar6 - lVar7;
                }
                if (-1 < lVar10) {
                  lVar7 = lVar6;
                }
              }
              local_f8 = CONCAT44(local_f8._4_4_,1);
            }
            lVar13 = lVar13 + 1;
            p = p + 1;
            pFVar9 = local_110;
            lVar6 = lVar7;
          }
          iVar12 = 0;
          while (sVar3 = lVar6, iVar12 < pFVar9->nToken) {
            while (((iVar16 = iVar12, lVar6 = sVar3, iVar5 == 0 && (local_111 == '\0')) &&
                   ((a[iVar16].bIgnore == 0 && ((long)((a[iVar16].iDocid - lVar6) * uVar17) < 0)))))
            {
              iVar5 = incrPhraseTokenNext(pTab,pFVar9,iVar16,a + iVar16,&local_111);
              lVar10 = (a[iVar16].iDocid - lVar6) * uVar17;
              pFVar9 = local_110;
              sVar3 = a[iVar16].iDocid;
              iVar12 = 0;
              if (lVar10 < 1) {
                sVar3 = lVar6;
                iVar12 = iVar16;
              }
            }
            iVar12 = iVar16 + 1;
          }
          lVar10 = CONCAT71((int7)((ulong)lVar10 >> 8),local_111);
          if (local_111 == '\0') {
            __n = (long)a[(long)pFVar9->nToken + -1].nList + 1;
            local_d0 = lVar10;
            __dest = (char *)sqlite3_malloc((int)__n);
            if (__dest == (char *)0x0) {
              iVar5 = 7;
              goto LAB_00170057;
            }
            memcpy(__dest,(&pR)[(long)local_110->nToken * 4],__n);
            uVar11 = 0;
            iVar12 = -1;
            ppcVar14 = &a[0].pList;
            iVar16 = 0;
            pFVar9 = local_110;
            while( true ) {
              uVar8 = (long)pFVar9->nToken - 1;
              if ((long)uVar8 <= (long)uVar11) break;
              if (((TokenDoclist *)(ppcVar14 + -2))->bIgnore == 0) {
                pL = *ppcVar14;
                local_f8 = uVar11;
                local_e8 = iVar16;
                local_e4 = iVar12;
                local_e0 = __dest;
                pR = __dest;
                iVar12 = fts3PoslistPhraseMerge(&local_e0,pFVar9->nToken + iVar12,0,1,&pL,&pR);
                pFVar9 = local_110;
                uVar11 = local_f8;
                if (iVar12 == 0) {
                  uVar8 = (ulong)(local_110->nToken - 1);
                  iVar16 = local_e8;
                  break;
                }
                iVar16 = (int)local_e0 - (int)__dest;
                iVar12 = local_e4;
              }
              uVar11 = uVar11 + 1;
              ppcVar14 = ppcVar14 + 4;
              iVar12 = iVar12 + -1;
            }
            if ((int)uVar8 == (int)uVar11) {
              (pFVar9->doclist).iDocid = lVar6;
              (pFVar9->doclist).pList = __dest;
              (pFVar9->doclist).nList = iVar16;
              (pFVar9->doclist).bFreeList = 1;
              lVar10 = 0;
              break;
            }
            sqlite3_free(__dest);
            pFVar9 = local_110;
            lVar10 = local_d0;
          }
        }
        uVar19 = (u8)lVar10;
        local_110 = pFVar9;
      }
      *local_d8 = uVar19;
    }
LAB_00170057:
    *local_f0 = iVar5;
    local_100->iDocid = (local_110->doclist).iDocid;
  }
  return;
}

Assistant:

static void fts3EvalNextRow(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expr. to advance to next matching row */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    int bDescDoclist = pCsr->bDesc;         /* Used by DOCID_CMP() macro */
    assert( pExpr->bEof==0 );
    pExpr->bStart = 1;

    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        assert( !pLeft->bDeferred || !pRight->bDeferred );

        if( pLeft->bDeferred ){
          /* LHS is entirely deferred. So we assume it matches every row.
          ** Advance the RHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pRight, pRc);
          pExpr->iDocid = pRight->iDocid;
          pExpr->bEof = pRight->bEof;
        }else if( pRight->bDeferred ){
          /* RHS is entirely deferred. So we assume it matches every row.
          ** Advance the LHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = pLeft->bEof;
        }else{
          /* Neither the RHS or LHS are deferred. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
          while( !pLeft->bEof && !pRight->bEof && *pRc==SQLITE_OK ){
            sqlite3_int64 iDiff = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
            if( iDiff==0 ) break;
            if( iDiff<0 ){
              fts3EvalNextRow(pCsr, pLeft, pRc);
            }else{
              fts3EvalNextRow(pCsr, pRight, pRc);
            }
          }
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = (pLeft->bEof || pRight->bEof);
          if( pExpr->eType==FTSQUERY_NEAR && pExpr->bEof ){
            if( pRight->pPhrase && pRight->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pRight->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pRight->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pRight, pRc);
              }
            }
            if( pLeft->pPhrase && pLeft->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pLeft->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pLeft->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pLeft, pRc);
              }
            }
          }
        }
        break;
      }
  
      case FTSQUERY_OR: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        sqlite3_int64 iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);

        assert( pLeft->bStart || pLeft->iDocid==pRight->iDocid );
        assert( pRight->bStart || pLeft->iDocid==pRight->iDocid );

        if( pRight->bEof || (pLeft->bEof==0 && iCmp<0) ){
          fts3EvalNextRow(pCsr, pLeft, pRc);
        }else if( pLeft->bEof || (pRight->bEof==0 && iCmp>0) ){
          fts3EvalNextRow(pCsr, pRight, pRc);
        }else{
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
        }

        pExpr->bEof = (pLeft->bEof && pRight->bEof);
        iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
        if( pRight->bEof || (pLeft->bEof==0 &&  iCmp<0) ){
          pExpr->iDocid = pLeft->iDocid;
        }else{
          pExpr->iDocid = pRight->iDocid;
        }

        break;
      }

      case FTSQUERY_NOT: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;

        if( pRight->bStart==0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
          assert( *pRc!=SQLITE_OK || pRight->bStart );
        }

        fts3EvalNextRow(pCsr, pLeft, pRc);
        if( pLeft->bEof==0 ){
          while( !*pRc 
              && !pRight->bEof 
              && DOCID_CMP(pLeft->iDocid, pRight->iDocid)>0 
          ){
            fts3EvalNextRow(pCsr, pRight, pRc);
          }
        }
        pExpr->iDocid = pLeft->iDocid;
        pExpr->bEof = pLeft->bEof;
        break;
      }

      default: {
        Fts3Phrase *pPhrase = pExpr->pPhrase;
        fts3EvalInvalidatePoslist(pPhrase);
        *pRc = fts3EvalPhraseNext(pCsr, pPhrase, &pExpr->bEof);
        pExpr->iDocid = pPhrase->doclist.iDocid;
        break;
      }
    }
  }
}